

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

void __thiscall Kernel::Clause::destroyExceptInferenceObject(Clause *this)

{
  void *in_RDI;
  size_t size;
  size_t in_stack_ffffffffffffffd8;
  Clause *in_stack_ffffffffffffffe0;
  
  if ((*(long *)((long)in_RDI + 0x50) != 0) &&
     (in_stack_ffffffffffffffe0 = *(Clause **)((long)in_RDI + 0x50),
     in_stack_ffffffffffffffe0 != (Clause *)0x0)) {
    Lib::InverseLookup<Kernel::Literal>::~InverseLookup((InverseLookup<Kernel::Literal> *)0x841fe8);
    Lib::InverseLookup<Kernel::Literal>::operator_delete
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  Shell::PartialRedundancyHandler::destroyClauseData(in_stack_ffffffffffffffe0);
  Lib::free(in_RDI);
  return;
}

Assistant:

void Clause::destroyExceptInferenceObject()
{
  if (_literalPositions) {
    delete _literalPositions;
  }

  PartialRedundancyHandler::destroyClauseData(this);

  RSTAT_CTR_INC("clauses deleted");

  //We have to get sizeof(Clause) + (_length-1)*sizeof(Literal*)
  //this way, because _length-1 wouldn't behave well for
  //_length==0 on x64 platform.
  size_t size = sizeof(Clause) + _length * sizeof(Literal*);
  size -= sizeof(Literal*);

  DEALLOC_KNOWN(this, size,"Clause");
}